

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall
CPP::WriteInitialization::LayoutDefaultHandler::writeProperty
          (LayoutDefaultHandler *this,int p,QString *indent,QString *objectName,
          DomPropertyMap *properties,QString *propertyName,QString *setter,int defaultStyleValue,
          bool suppressDefault,QTextStream *str)

{
  int value;
  bool bVar1;
  uint uVar2;
  DomProperty *pDVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = QHash<QString,_DomProperty_*>::value(properties,propertyName);
  if (pDVar3 == (DomProperty *)0x0) {
    if (!suppressDefault) {
LAB_0011df6d:
      if ((this->m_state[p] & 2) == 0) {
        if ((this->m_state[p] & 1) != 0) {
          if (p == 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              writeContentsMargins(indent,objectName,this->m_defaultValues[p],str);
              return;
            }
          }
          else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            anon_unknown.dwarf_9d8bc::writeSetter<int>
                      (indent,objectName,setter,this->m_defaultValues[p],str);
            return;
          }
          goto LAB_0011e0b2;
        }
      }
      else {
        local_50.d = this->m_functions[p].d.d;
        local_50.ptr = this->m_functions[p].d.ptr;
        local_50.size = this->m_functions[p].d.size;
        if (local_50.d != (Data *)0x0) {
          LOCK();
          ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        anon_unknown.dwarf_9d8bc::writeSetter<QString>
                  (indent,objectName,setter,(QString *)&local_50,str);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      }
    }
  }
  else {
    value = pDVar3->m_number;
    uVar2 = this->m_state[p];
    if (!suppressDefault && uVar2 == 3) {
      if (value == this->m_defaultValues[p]) goto LAB_0011df6d;
      uVar2 = 3;
    }
    bVar1 = (uVar2 & 3) == 0;
    if (defaultStyleValue == value && bVar1) {
      QTextStream::operator<<(str,"#ifndef Q_OS_MAC\n");
    }
    if (p == 0) {
      writeContentsMargins(indent,objectName,value,str);
    }
    else {
      anon_unknown.dwarf_9d8bc::writeSetter<int>(indent,objectName,setter,value,str);
    }
    if (defaultStyleValue == value && bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QTextStream::operator<<(str,"#endif\n");
        return;
      }
      goto LAB_0011e0b2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011e0b2:
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::LayoutDefaultHandler::writeProperty(int p, const QString &indent, const QString &objectName,
                                                              const DomPropertyMap &properties, const QString &propertyName, const QString &setter,
                                                              int defaultStyleValue, bool suppressDefault, QTextStream &str) const
{
    // User value
    if (const DomProperty *prop = properties.value(propertyName)) {
        const int value = prop->elementNumber();
        // Emulate the pre 4.3 behaviour: The value form default value was only used to determine
        // the default value, layout properties were always written
        const bool useLayoutFunctionPre43 = !suppressDefault && (m_state[p] == (HasDefaultFunction|HasDefaultValue)) && value == m_defaultValues[p];
        if (!useLayoutFunctionPre43) {
            bool ifndefMac = (!(m_state[p] & (HasDefaultFunction|HasDefaultValue))
                             && value == defaultStyleValue);
            if (ifndefMac)
                str << "#ifndef Q_OS_MAC\n";
            if (p == Margin) { // Use setContentsMargins for numeric values
                writeContentsMargins(indent, objectName, value, str);
            } else {
                writeSetter(indent, objectName, setter, value, str);
            }
            if (ifndefMac)
                str << "#endif\n";
            return;
        }
    }
    if (suppressDefault)
        return;
    // get default.
    if (m_state[p] & HasDefaultFunction) {
        // Do not use setContentsMargins to avoid repetitive evaluations.
        writeSetter(indent, objectName, setter, m_functions[p], str);
        return;
    }
    if (m_state[p] & HasDefaultValue) {
        if (p == Margin) { // Use setContentsMargins for numeric values
            writeContentsMargins(indent, objectName, m_defaultValues[p], str);
        } else {
            writeSetter(indent, objectName, setter, m_defaultValues[p], str);
        }
    }
}